

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O0

void Hop_TableProfile(Hop_Man_t *p)

{
  uint local_20;
  int local_1c;
  int Counter;
  int i;
  Hop_Obj_t *pEntry;
  Hop_Man_t *p_local;
  
  for (local_1c = 0; local_1c < p->nTableSize; local_1c = local_1c + 1) {
    local_20 = 0;
    for (_Counter = p->pTable[local_1c]; _Counter != (Hop_Obj_t *)0x0;
        _Counter = (_Counter->field_1).pNext) {
      local_20 = local_20 + 1;
    }
    if (local_20 != 0) {
      printf("%d ",(ulong)local_20);
    }
  }
  return;
}

Assistant:

void Hop_TableProfile( Hop_Man_t * p )
{
    Hop_Obj_t * pEntry;
    int i, Counter;
    for ( i = 0; i < p->nTableSize; i++ )
    {
        Counter = 0;
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
}